

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O2

void __thiscall btCollisionWorld::debugDrawWorld(btCollisionWorld *this)

{
  btCollisionObject *pbVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  int i;
  long lVar5;
  float fVar6;
  long lVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  btVector3 colorvec;
  DefaultColors defaultColors;
  undefined8 local_118;
  float fStack_110;
  float fStack_10c;
  undefined8 local_108;
  float local_100;
  float local_fc;
  undefined8 local_f8;
  float local_f0;
  float local_ec;
  undefined8 local_e8;
  float local_e0;
  float local_dc;
  float local_d8;
  btScalar bStack_d4;
  btScalar bStack_d0;
  btScalar bStack_cc;
  undefined1 local_c8 [16];
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a0;
  undefined4 uStack_9c;
  float fStack_98;
  float fStack_94;
  undefined4 local_90;
  undefined4 uStack_8c;
  float fStack_88;
  float fStack_84;
  undefined4 local_80;
  undefined4 uStack_7c;
  float fStack_78;
  float fStack_74;
  undefined4 local_70;
  undefined4 uStack_6c;
  float fStack_68;
  float fStack_64;
  undefined4 local_60;
  undefined4 uStack_5c;
  float fStack_58;
  float fStack_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined1 local_40 [16];
  
  iVar2 = (*this->_vptr_btCollisionWorld[5])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    iVar2 = (*this->_vptr_btCollisionWorld[5])(this);
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x10))(&local_a0);
    iVar2 = (*this->_vptr_btCollisionWorld[5])(this);
    uVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x70))
                      ((long *)CONCAT44(extraout_var_01,iVar2));
    if (((uVar4 & 8) != 0) && (this->m_dispatcher1 != (btDispatcher *)0x0)) {
      local_d8 = (float)(*this->m_dispatcher1->_vptr_btDispatcher[9])();
      if ((int)local_d8 < 1) {
        local_d8 = 0.0;
      }
      fVar6 = 0.0;
      while (fVar6 != local_d8) {
        local_c8._0_4_ = fVar6;
        iVar2 = (*this->m_dispatcher1->_vptr_btDispatcher[10])();
        lVar5 = CONCAT44(extraout_var_02,iVar2);
        uVar4 = (ulong)*(uint *)(lVar5 + 0x318);
        if ((int)*(uint *)(lVar5 + 0x318) < 1) {
          uVar4 = 0;
        }
        for (lVar7 = 0; uVar4 * 0xc0 - lVar7 != 0; lVar7 = lVar7 + 0xc0) {
          iVar2 = (*this->_vptr_btCollisionWorld[5])(this);
          (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 0x50))
                    (*(undefined4 *)(lVar5 + 0x58 + lVar7),(long *)CONCAT44(extraout_var_03,iVar2),
                     lVar7 + lVar5 + 0x28,lVar5 + 0x48 + lVar7,*(undefined4 *)(lVar5 + 0xa0 + lVar7)
                     ,local_40);
        }
        fVar6 = (float)(local_c8._0_4_ + 1);
      }
    }
    iVar2 = (*this->_vptr_btCollisionWorld[5])(this);
    uVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 0x70))
                      ((long *)CONCAT44(extraout_var_04,iVar2));
    if ((uVar4 & 3) != 0) {
      for (lVar5 = 0; lVar5 < (this->m_collisionObjects).m_size; lVar5 = lVar5 + 1) {
        pbVar1 = (this->m_collisionObjects).m_data[lVar5];
        if ((pbVar1->m_collisionFlags & 0x20) == 0) {
          iVar2 = (*this->_vptr_btCollisionWorld[5])(this);
          if (CONCAT44(extraout_var_05,iVar2) != 0) {
            iVar2 = (*this->_vptr_btCollisionWorld[5])(this);
            uVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar2) + 0x70))
                              ((long *)CONCAT44(extraout_var_06,iVar2));
            if ((uVar4 & 1) != 0) {
              switch(pbVar1->m_activationState1) {
              case 1:
                uVar8 = local_a0;
                uVar9 = uStack_9c;
                fStack_110 = fStack_98;
                fStack_10c = fStack_94;
                break;
              case 2:
                uVar8 = local_90;
                uVar9 = uStack_8c;
                fStack_110 = fStack_88;
                fStack_10c = fStack_84;
                break;
              case 3:
                uVar8 = local_80;
                uVar9 = uStack_7c;
                fStack_110 = fStack_78;
                fStack_10c = fStack_74;
                break;
              case 4:
                uVar8 = local_70;
                uVar9 = uStack_6c;
                fStack_110 = fStack_68;
                fStack_10c = fStack_64;
                break;
              case 5:
                uVar8 = local_60;
                uVar9 = uStack_5c;
                fStack_110 = fStack_58;
                fStack_10c = fStack_54;
                break;
              default:
                uVar8 = 0x3e99999a;
                uVar9 = 0x3e99999a;
                fStack_110 = 0.3;
                fStack_10c = 0.0;
              }
              local_118 = CONCAT44(uVar9,uVar8);
              (*this->_vptr_btCollisionWorld[7])
                        (this,&pbVar1->m_worldTransform,pbVar1->m_collisionShape,&local_118);
            }
          }
          if ((this->m_debugDrawer != (btIDebugDraw *)0x0) &&
             (uVar3 = (*this->m_debugDrawer->_vptr_btIDebugDraw[0xe])(), (uVar3 & 2) != 0)) {
            local_b8 = local_50;
            uStack_b4 = uStack_4c;
            uStack_b0 = uStack_48;
            uStack_ac = uStack_44;
            (*pbVar1->m_collisionShape->_vptr_btCollisionShape[2])
                      (pbVar1->m_collisionShape,&pbVar1->m_worldTransform,&local_118,&local_108);
            local_118 = CONCAT44((float)((ulong)local_118 >> 0x20) - gContactBreakingThreshold,
                                 (float)local_118 - gContactBreakingThreshold);
            fStack_110 = fStack_110 - gContactBreakingThreshold;
            local_108 = CONCAT44((float)((ulong)local_108 >> 0x20) + gContactBreakingThreshold,
                                 (float)local_108 + gContactBreakingThreshold);
            local_100 = local_100 + gContactBreakingThreshold;
            if (((this->m_dispatchInfo).m_useContinuous == true) &&
               ((pbVar1->m_internalType == 2 && ((pbVar1->m_collisionFlags & 3) == 0)))) {
              local_c8 = ZEXT416((uint)gContactBreakingThreshold);
              local_d8 = gContactBreakingThreshold;
              bStack_d4 = gContactBreakingThreshold;
              bStack_d0 = gContactBreakingThreshold;
              bStack_cc = gContactBreakingThreshold;
              (*pbVar1->m_collisionShape->_vptr_btCollisionShape[2])
                        (pbVar1->m_collisionShape,&pbVar1->m_interpolationWorldTransform,&local_e8,
                         &local_f8);
              fVar11 = (float)local_e8 - local_d8;
              fVar12 = (float)((ulong)local_e8 >> 0x20) - bStack_d4;
              local_e8 = CONCAT44(fVar12,fVar11);
              local_e0 = local_e0 - (float)local_c8._0_4_;
              fVar6 = (float)local_f8 + local_d8;
              fVar10 = (float)((ulong)local_f8 >> 0x20) + bStack_d4;
              local_f8 = CONCAT44(fVar10,fVar6);
              local_f0 = (float)local_c8._0_4_ + local_f0;
              if (fVar11 < (float)local_118) {
                local_118 = CONCAT44(local_118._4_4_,fVar11);
              }
              if (fVar12 < local_118._4_4_) {
                local_118 = CONCAT44(fVar12,(float)local_118);
              }
              if (local_e0 < fStack_110) {
                fStack_110 = local_e0;
              }
              if (local_dc < fStack_10c) {
                fStack_10c = local_dc;
              }
              if ((float)local_108 < fVar6) {
                local_108 = CONCAT44(local_108._4_4_,fVar6);
              }
              if (local_108._4_4_ < fVar10) {
                local_108 = CONCAT44(fVar10,(float)local_108);
              }
              if (local_100 < local_f0) {
                local_100 = local_f0;
              }
              if (local_fc < local_ec) {
                local_fc = local_ec;
              }
            }
            (*this->m_debugDrawer->_vptr_btIDebugDraw[0xf])
                      (this->m_debugDrawer,&local_118,&local_108,&local_b8);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void	btCollisionWorld::debugDrawWorld()
{
	if (getDebugDrawer())
	{
		btIDebugDraw::DefaultColors defaultColors = getDebugDrawer()->getDefaultColors();

		if ( getDebugDrawer()->getDebugMode() & btIDebugDraw::DBG_DrawContactPoints)
		{
		

			if (getDispatcher())
			{
				int numManifolds = getDispatcher()->getNumManifolds();
			
				for (int i=0;i<numManifolds;i++)
				{
					btPersistentManifold* contactManifold = getDispatcher()->getManifoldByIndexInternal(i);
					//btCollisionObject* obA = static_cast<btCollisionObject*>(contactManifold->getBody0());
					//btCollisionObject* obB = static_cast<btCollisionObject*>(contactManifold->getBody1());

					int numContacts = contactManifold->getNumContacts();
					for (int j=0;j<numContacts;j++)
					{
						btManifoldPoint& cp = contactManifold->getContactPoint(j);
						getDebugDrawer()->drawContactPoint(cp.m_positionWorldOnB,cp.m_normalWorldOnB,cp.getDistance(),cp.getLifeTime(),defaultColors.m_contactPoint);
					}
				}
			}
		}

		if ((getDebugDrawer()->getDebugMode() & (btIDebugDraw::DBG_DrawWireframe | btIDebugDraw::DBG_DrawAabb)))
		{
			int i;

			for (  i=0;i<m_collisionObjects.size();i++)
			{
				btCollisionObject* colObj = m_collisionObjects[i];
				if ((colObj->getCollisionFlags() & btCollisionObject::CF_DISABLE_VISUALIZE_OBJECT)==0)
				{
					if (getDebugDrawer() && (getDebugDrawer()->getDebugMode() & btIDebugDraw::DBG_DrawWireframe))
					{
						btVector3 color(btScalar(0.4),btScalar(0.4),btScalar(0.4));

						switch(colObj->getActivationState())
						{
						case  ACTIVE_TAG:
							color = defaultColors.m_activeObject; break;
						case ISLAND_SLEEPING:
							color =  defaultColors.m_deactivatedObject;break;
						case WANTS_DEACTIVATION:
							color = defaultColors.m_wantsDeactivationObject;break;
						case DISABLE_DEACTIVATION:
							color = defaultColors.m_disabledDeactivationObject;break;
						case DISABLE_SIMULATION:
							color = defaultColors.m_disabledSimulationObject;break;
						default:
							{
								color = btVector3(btScalar(.3),btScalar(0.3),btScalar(0.3));
							}
						};

						debugDrawObject(colObj->getWorldTransform(),colObj->getCollisionShape(),color);
					}
					if (m_debugDrawer && (m_debugDrawer->getDebugMode() & btIDebugDraw::DBG_DrawAabb))
					{
						btVector3 minAabb,maxAabb;
						btVector3 colorvec = defaultColors.m_aabb;
						colObj->getCollisionShape()->getAabb(colObj->getWorldTransform(), minAabb,maxAabb);
						btVector3 contactThreshold(gContactBreakingThreshold,gContactBreakingThreshold,gContactBreakingThreshold);
						minAabb -= contactThreshold;
						maxAabb += contactThreshold;

						btVector3 minAabb2,maxAabb2;

						if(getDispatchInfo().m_useContinuous && colObj->getInternalType()==btCollisionObject::CO_RIGID_BODY && !colObj->isStaticOrKinematicObject())
						{
							colObj->getCollisionShape()->getAabb(colObj->getInterpolationWorldTransform(),minAabb2,maxAabb2);
							minAabb2 -= contactThreshold;
							maxAabb2 += contactThreshold;
							minAabb.setMin(minAabb2);
							maxAabb.setMax(maxAabb2);
						}

						m_debugDrawer->drawAabb(minAabb,maxAabb,colorvec);
					}
				}
			}
		}
	}
}